

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::move_into(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  node *pnVar6;
  raw_node *prVar7;
  uint uVar8;
  byte bVar9;
  
  bVar9 = 0;
  uVar2 = hash_key(this,(vec<16U,_float> *)pNode);
  prVar1 = (this->m_values).m_p;
  prVar7 = prVar1 + uVar2;
  if (prVar1[uVar2].m_bits[0x44] != '\0') {
    uVar4 = (this->m_values).m_size - 1;
    uVar8 = uVar2;
    do {
      uVar5 = uVar8 - 1;
      if (uVar8 == 0) {
        uVar5 = uVar4;
      }
      if (uVar5 == uVar2) {
        return;
      }
      prVar7 = prVar7 + -1;
      if (uVar8 == 0) {
        prVar7 = prVar1 + uVar4;
      }
      uVar8 = uVar5;
    } while (prVar7->m_bits[0x44] != '\0');
  }
  pnVar6 = pNode;
  for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(float *)prVar7->m_bits = (pnVar6->super_value_type).first.m_s[0];
    pnVar6 = (node *)((long)pnVar6 + (ulong)bVar9 * -8 + 4);
    prVar7 = (raw_node *)((long)prVar7 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pNode->state = '\0';
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline void move_into(node* pNode)
        {
            int index = hash_key(pNode->first);
            node* pDst_node = &get_node(index);

            if (pDst_node->state)
            {
                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pDst_node = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pDst_node--;
                    }

                    if (index == orig_index)
                    {
                        CRNLIB_ASSERT(false);
                        return;
                    }

                    if (!pDst_node->state)
                    {
                        break;
                    }
                }
            }

            move_node(pDst_node, pNode);

            m_num_valid++;
        }